

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proto_writer.cc
# Opt level: O2

Field * __thiscall
google::protobuf::util::converter::ProtoWriter::BeginNamed
          (ProtoWriter *this,StringPiece name,bool is_list)

{
  Field *pFVar1;
  StringPiece local_38;
  
  if (this->invalid_depth_ < 1) {
    pFVar1 = Lookup(this,name);
    if (pFVar1 == (Field *)0x0) {
      this->invalid_depth_ = this->invalid_depth_ + 1;
    }
    else {
      if (!is_list) {
        return pFVar1;
      }
      if (pFVar1->cardinality_ == 3) {
        return pFVar1;
      }
      this->invalid_depth_ = this->invalid_depth_ + 1;
      StringPiece::StringPiece(&local_38,"Proto field is not repeating, cannot start list.");
      InvalidName(this,name,local_38);
    }
  }
  else {
    this->invalid_depth_ = this->invalid_depth_ + 1;
  }
  return (Field *)0x0;
}

Assistant:

const google::protobuf::Field* ProtoWriter::BeginNamed(StringPiece name,
                                                       bool is_list) {
  if (invalid_depth_ > 0) {
    ++invalid_depth_;
    return nullptr;
  }
  const google::protobuf::Field* field = Lookup(name);
  if (field == nullptr) {
    ++invalid_depth_;
    // InvalidName() already called in Lookup().
    return nullptr;
  }
  if (is_list && !IsRepeated(*field)) {
    ++invalid_depth_;
    InvalidName(name, "Proto field is not repeating, cannot start list.");
    return nullptr;
  }
  return field;
}